

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O1

bool __thiscall
Fossilize::ApplicationInfoFilter::Impl::needs_buckets(Impl *this,VkApplicationInfo *info)

{
  iterator iVar1;
  bool bVar2;
  allocator local_41;
  key_type local_40;
  
  if (info != (VkApplicationInfo *)0x0) {
    if (info->pApplicationName != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_40,info->pApplicationName,&local_41);
      iVar1 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->application_infos)._M_h,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (iVar1.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
          ._M_cur != (__node_type *)0x0) {
        if (*(long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                            ._M_cur + 0x50) !=
            *(long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                            ._M_cur + 0x58)) {
          return true;
        }
        if (*(long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                            ._M_cur + 0x68) !=
            *(long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                            ._M_cur + 0x70)) {
          return true;
        }
      }
    }
    if (info->pEngineName != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_40,info->pEngineName,&local_41);
      iVar1 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->engine_infos)._M_h,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (iVar1.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
          ._M_cur != (__node_type *)0x0) {
        if (*(long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                            ._M_cur + 0x50) !=
            *(long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                            ._M_cur + 0x58)) {
          return true;
        }
        if (*(long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                            ._M_cur + 0x68) !=
            *(long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                            ._M_cur + 0x70)) {
          return true;
        }
      }
    }
  }
  bVar2 = true;
  if ((this->default_variant_dependencies).
      super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->default_variant_dependencies).
      super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = (this->default_variant_dependencies_feature).
            super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->default_variant_dependencies_feature).
            super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  return bVar2;
}

Assistant:

bool ApplicationInfoFilter::Impl::needs_buckets(const VkApplicationInfo *info)
{
	if (info && info->pApplicationName)
	{
		auto itr = application_infos.find(info->pApplicationName);
		if (itr != application_infos.end())
			if (!itr->second.variant_dependencies.empty() || !itr->second.variant_dependencies_feature.empty())
				return true;
	}

	if (info && info->pEngineName)
	{
		auto itr = engine_infos.find(info->pEngineName);
		if (itr != engine_infos.end())
			if (!itr->second.variant_dependencies.empty() || !itr->second.variant_dependencies_feature.empty())
				return true;
	}

	return !default_variant_dependencies.empty() || !default_variant_dependencies_feature.empty();
}